

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_construct_destruct_withCapacityAndAllocator_valid_fn(int _i)

{
  AString *str;
  char *pcVar1;
  ACUtilsReallocator *pp_Var2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ACUtilsReallocator p_Var7;
  ACUtilsReallocator local_38;
  char *local_30;
  code *local_28;
  undefined8 uStack_20;
  
  private_ACUtilsTest_AString_reallocFail = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  private_ACUtilsTest_AString_reallocCount = 0;
  uStack_20 = 0x11df8b;
  str = AString_constructWithCapacityAndAllocator
                  (0x29a,private_ACUtilsTest_AString_realloc,private_ACUtilsTest_AString_free);
  if (str == (AString *)0x0) {
    pp_Var2 = &local_28;
    pcVar4 = "Assertion \'_ck_x != NULL\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %#x";
    pcVar6 = "(void*) string != NULL";
    pcVar5 = "(void*) string";
    iVar3 = 0x86;
LAB_0011e25d:
    uStack_20 = 0;
    local_28 = (code *)0x0;
    *(undefined8 *)((long)pp_Var2 + -8) = 0x11e264;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar3,pcVar4,pcVar1,pcVar6,pcVar5);
  }
  uStack_20 = 0x11dfa8;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x86);
  p_Var7 = str->reallocator;
  if (p_Var7 == private_ACUtilsTest_AString_realloc) {
    uStack_20 = 0x11dfc5;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x87);
    p_Var7 = (ACUtilsReallocator)str->deallocator;
    if (p_Var7 == private_ACUtilsTest_AString_free) {
      uStack_20 = 0x11dfe3;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x88);
      p_Var7 = (ACUtilsReallocator)str->capacity;
      if (p_Var7 == (ACUtilsReallocator)0x29a) {
        uStack_20 = 0x11e005;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x89);
        if (str->buffer == (char *)0x0) {
          pp_Var2 = &local_28;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar1 = "Assertion \'%s\' failed: %s == %#x";
          pcVar6 = "(void*) (*string).buffer != NULL";
          pcVar5 = "(void*) (*string).buffer";
        }
        else {
          uStack_20 = 0x11e021;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x89);
          pcVar1 = str->buffer;
          if (pcVar1 == (char *)0x0) {
            pcVar1 = "(null)";
            pcVar4 = "";
LAB_0011e1ce:
            uStack_20 = 0;
            local_28 = (code *)0x15b593;
            local_30 = "";
            local_38 = (ACUtilsReallocator)0x15b593;
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x89,
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                              "(*string).buffer == (\"\")","(*string).buffer",pcVar4,pcVar1,pcVar4,
                              "(\"\")");
          }
          if (*pcVar1 != '\0') {
            pcVar4 = "\"";
            goto LAB_0011e1ce;
          }
          uStack_20 = 0x11e050;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x89);
          local_38 = (ACUtilsReallocator)str->size;
          if (local_38 == (ACUtilsReallocator)0x0) {
            uStack_20 = 0x11e06e;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x89);
            uStack_20 = 0x11e076;
            AString_destruct(str);
            if (private_ACUtilsTest_AString_reallocCount == private_ACUtilsTest_AString_freeCount) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8b);
              return;
            }
            pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = 
            "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)";
            pcVar6 = "private_ACUtilsTest_AString_reallocCount";
            iVar3 = 0x8b;
            local_28 = (code *)private_ACUtilsTest_AString_freeCount;
            local_30 = "(private_ACUtilsTest_AString_freeCount)";
            p_Var7 = (ACUtilsReallocator)private_ACUtilsTest_AString_reallocCount;
            goto LAB_0011e29a;
          }
          pp_Var2 = &local_38;
          local_30 = "strlen(\"\")";
          pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar6 = "(*string).size == strlen(\"\")";
          pcVar5 = "(*string).size";
        }
        iVar3 = 0x89;
        goto LAB_0011e25d;
      }
      local_30 = "(666)";
      pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "(*string).capacity == (666)";
      pcVar6 = "(*string).capacity";
      iVar3 = 0x89;
      local_28 = (code *)0x29a;
    }
    else {
      local_30 = "(void*) private_ACUtilsTest_AString_free";
      pcVar1 = "Assertion \'%s\' failed: %s == %#x, %s == %#x";
      pcVar4 = "(void*) string->deallocator == (void*) private_ACUtilsTest_AString_free";
      pcVar6 = "(void*) string->deallocator";
      iVar3 = 0x88;
      local_28 = private_ACUtilsTest_AString_free;
    }
  }
  else {
    local_30 = "(void*) private_ACUtilsTest_AString_realloc";
    pcVar1 = "Assertion \'%s\' failed: %s == %#x, %s == %#x";
    pcVar4 = "(void*) string->reallocator == (void*) private_ACUtilsTest_AString_realloc";
    pcVar6 = "(void*) string->reallocator";
    iVar3 = 0x87;
    local_28 = private_ACUtilsTest_AString_realloc;
  }
LAB_0011e29a:
  uStack_20 = 0;
  local_38 = p_Var7;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar3,"Assertion \'_ck_x == _ck_y\' failed",pcVar1,pcVar4,pcVar6);
}

Assistant:

static void private_ACUtilsTest_AString_setReallocFail(bool reallocFail, size_t failCounter)
{
    if(reallocFail) {
        private_ACUtilsTest_AString_reallocFailCounter = failCounter;
        private_ACUtilsTest_AString_reallocFail = true;
    } else {
        private_ACUtilsTest_AString_reallocFail = false;
    }
}